

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O1

REF_STATUS ref_geom_remove(REF_GEOM ref_geom,REF_INT geom)

{
  REF_INT *pRVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = 3;
  if ((-1 < geom) && (geom < ref_geom->max)) {
    uVar3 = (ulong)(uint)(geom * 6);
    if (ref_geom->descr[uVar3] != -1) {
      uVar2 = ref_adj_remove(ref_geom->ref_adj,ref_geom->descr[uVar3 + 5],geom);
      if (uVar2 == 0) {
        pRVar1 = ref_geom->descr;
        pRVar1[uVar3] = -1;
        pRVar1[uVar3 + 1] = ref_geom->blank;
        ref_geom->blank = geom;
        ref_geom->n = ref_geom->n + -1;
        uVar2 = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0x235,"ref_geom_remove",(ulong)uVar2,"unregister geom");
      }
    }
  }
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_remove(REF_GEOM ref_geom, REF_INT geom) {
  REF_ADJ ref_adj = ref_geom_adj(ref_geom);
  REF_INT node;

  if (geom < 0 || ref_geom_max(ref_geom) <= geom) return REF_INVALID;
  if (REF_EMPTY == ref_geom_type(ref_geom, geom)) return REF_INVALID;

  node = ref_geom_node(ref_geom, geom);
  RSS(ref_adj_remove(ref_adj, node, geom), "unregister geom");

  ref_geom_type(ref_geom, geom) = REF_EMPTY;
  ref_geom_id(ref_geom, geom) = ref_geom_blank(ref_geom);
  ref_geom_blank(ref_geom) = geom;
  ref_geom_n(ref_geom)--;

  return REF_SUCCESS;
}